

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * __thiscall
tinyformat::format<long,long,long,long>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,long *args,long *args_1,
          long *args_2,long *args_3)

{
  ostringstream local_1b0 [8];
  ostringstream oss;
  long *args_local_3;
  long *args_local_2;
  long *args_local_1;
  long *args_local;
  char *fmt_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<long,long,long,long>((ostream *)local_1b0,(char *)this,(long *)fmt,args,args_1,args_2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}